

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

ecs_entity_t
ecs_new_system(ecs_world_t *world,ecs_entity_t e,char *name,ecs_entity_t tag,char *signature,
              ecs_iter_action_t action)

{
  int iVar1;
  ecs_entity_t local_58;
  long *local_50;
  EcsSignatureExpr *expr;
  ecs_entity_t eStack_40;
  _Bool added;
  ecs_entity_t result;
  ecs_iter_action_t action_local;
  char *signature_local;
  ecs_entity_t tag_local;
  char *name_local;
  ecs_entity_t e_local;
  ecs_world_t *world_local;
  
  result = (ecs_entity_t)action;
  action_local = (ecs_iter_action_t)signature;
  signature_local = (char *)tag;
  tag_local = (ecs_entity_t)name;
  name_local = (char *)e;
  e_local = (ecs_entity_t)world;
  _ecs_assert(world->magic == 0x65637377,0x1a,(char *)0x0,"world->magic == ECS_WORLD_MAGIC",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
              ,0x333);
  if (*(int *)e_local != 0x65637377) {
    __assert_fail("world->magic == (0x65637377)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
                  ,0x333,
                  "ecs_entity_t ecs_new_system(ecs_world_t *, ecs_entity_t, const char *, ecs_entity_t, const char *, ecs_iter_action_t)"
                 );
  }
  _ecs_assert((_Bool)((*(byte *)(e_local + 0x5c91) ^ 0xff) & 1),0x19,(char *)0x0,
              "!world->in_progress",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
              ,0x334);
  if ((*(byte *)(e_local + 0x5c91) & 1) == 0) {
    eStack_40 = ecs_lookup_w_id((ecs_world_t *)e_local,(ecs_entity_t)name_local,(char *)tag_local);
    if (eStack_40 == 0) {
      eStack_40 = ecs_new_entity((ecs_world_t *)e_local,0,(char *)tag_local,(char *)0x0);
    }
    if (signature_local != (char *)0x0) {
      ecs_add_entity((ecs_world_t *)e_local,eStack_40,(ecs_entity_t)signature_local);
    }
    expr._7_1_ = 0;
    local_50 = (long *)ecs_get_mut_w_entity
                                 ((ecs_world_t *)e_local,eStack_40,8,(_Bool *)((long)&expr + 7));
    if ((expr._7_1_ & 1) == 0) {
      if ((*local_50 == 0) || (action_local == (ecs_iter_action_t)0x0)) {
        if ((((ecs_iter_action_t)*local_50 != action_local) &&
            ((*local_50 == 0 || (iVar1 = strcmp((char *)*local_50,"0"), iVar1 != 0)))) &&
           ((action_local == (ecs_iter_action_t)0x0 ||
            (iVar1 = strcmp((char *)action_local,"0"), iVar1 != 0)))) {
          _ecs_abort(0xe,(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
                     ,0x34b);
          abort();
        }
      }
      else {
        iVar1 = strcmp((char *)*local_50,(char *)action_local);
        if (iVar1 != 0) {
          _ecs_abort(0xe,(char *)tag_local,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
                     ,0x350);
          abort();
        }
      }
    }
    else {
      *local_50 = (long)action_local;
    }
    ecs_modified_w_entity((ecs_world_t *)e_local,eStack_40,8);
    local_58 = result;
    ecs_set_ptr_w_entity((ecs_world_t *)e_local,eStack_40,0xb,8,&local_58);
    return eStack_40;
  }
  __assert_fail("!world->in_progress",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
                ,0x334,
                "ecs_entity_t ecs_new_system(ecs_world_t *, ecs_entity_t, const char *, ecs_entity_t, const char *, ecs_iter_action_t)"
               );
}

Assistant:

ecs_entity_t ecs_new_system(
    ecs_world_t *world,
    ecs_entity_t e,
    const char *name,
    ecs_entity_t tag,
    const char *signature,
    ecs_iter_action_t action)
{
    ecs_assert(world->magic == ECS_WORLD_MAGIC, ECS_INVALID_FROM_WORKER, NULL);
    ecs_assert(!world->in_progress, ECS_INVALID_WHILE_ITERATING, NULL);

    ecs_entity_t result = ecs_lookup_w_id(world, e, name);
    if (!result) {
        result = ecs_new_entity(world, 0, name, NULL);
    }

    if (tag) {
        ecs_add_entity(world, result, tag);
    }

    bool added = false;
    EcsSignatureExpr *expr = ecs_get_mut(world, result, EcsSignatureExpr, &added);
    if (added) {
        expr->expr = signature;
    } else {
        if (!expr->expr || !signature) {
            if (expr->expr != signature) {
                if (expr->expr && !strcmp(expr->expr, "0")) {
                    /* Ok */
                } else if (signature && !strcmp(signature, "0")) {
                    /* Ok */
                } else {
                    ecs_abort(ECS_ALREADY_DEFINED, NULL);
                }
            }
        } else {
            if (strcmp(expr->expr, signature)) {
                ecs_abort(ECS_ALREADY_DEFINED, name);
            }
        }
    }

    ecs_modified(world, result, EcsSignatureExpr);

    ecs_set(world, result, EcsIterAction, {action});

    return result;
}